

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  char *__assertion;
  flags_storage<3UL> local_4c;
  flags_storage<3UL> local_4b;
  array<unsigned_char,_1UL> local_4a;
  animal a2;
  animal a3;
  
  tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
            ((typed_flags<eats_meat,eats_grass,has_tail> *)&a2,"101",0xffffffffffffffff,'0','1');
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a3,
             (flags_storage<3ul> *)&a2,'0','1');
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a3,
                          "101");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&a3);
    a3.super_flags_storage<3UL>.m_data._M_elems[0] =
         (flags_storage<3UL>)(array<unsigned_char,_1UL>)0x5;
    tfl::typed_flags<eats_meat,eats_grass,has_tail>::typed_flags<char,std::char_traits<char>>
              ((typed_flags<eats_meat,eats_grass,has_tail> *)&local_4c,"001",0xffffffffffffffff,'0',
               '1');
    tfl::typed_flags<eats_meat,_eats_grass,_has_tail>::operator&=
              ((typed_flags<eats_meat,_eats_grass,_has_tail> *)&a3.super_flags_storage<3UL>,
               (this_type *)&local_4c);
    local_4c.m_data._M_elems[0] = (array<unsigned_char,_1UL>)(_Type)0x1;
    bVar1 = tfl::detail::flags_storage<3UL>::is_equal(&a3.super_flags_storage<3UL>,&local_4c);
    if (bVar1) {
      local_4a._M_elems[0] = (_Type)'\x02';
      local_4c.m_data._M_elems[0] =
           (array<unsigned_char,_1UL>)
           tfl::operator|(&a3,(typed_flags<eats_meat,_eats_grass,_has_tail> *)&local_4a);
      local_4b.m_data._M_elems[0] = (array<unsigned_char,_1UL>)(_Type)0x3;
      bVar1 = tfl::detail::flags_storage<3UL>::is_equal(&local_4c,&local_4b);
      if (bVar1) {
        return 0;
      }
      __assertion = "(a3 | animal{2}) == animal{3}";
      __line = 0x3f;
    }
    else {
      __assertion = "a3 == animal{flag<eats_meat>{1}}";
      __line = 0x3e;
    }
  }
  else {
    __assertion = "a2.to_string() == \"101\"";
    __line = 0x39;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                ,__line,"int main()");
}

Assistant:

int main()
{
    // unlike std::bitset typed_flags allocates less memory
    assert( sizeof(animal) == 1 );
    
    // create flags from scratch
    animal wolf;
    wolf.set<eats_grass>(false);
    wolf.set<eats_meat, has_tail>();
    wolf.set(flag<has_tail>{1}, flag<eats_meat>{1});
    
    // create flags with flexible human-readable constructor
    wolf = animal{flag<has_tail>{1}, flag<eats_meat>{1}, flag<eats_grass>{0}};
    
    // test each flag separately
    assert( (wolf.test<eats_meat>() && wolf.test<has_tail>()) );
    
    // test group off flags in one call
    assert( (wolf.all<eats_meat, has_tail>()) );
    assert( (wolf.any<eats_meat, has_tail, eats_grass>()) );
    assert( (wolf.none<eats_grass>()) );
    
    // extract flag values
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    wolf.get(f1, f2);
    wolf.get(f3);
    assert( f1 && !f2 && f3 );
    
    // like std::bitset create flags from integers or strings 
    // and convert vice versa
    auto a1 = animal{3};
    auto a2 = animal{"101"};
    assert( a1.to_integral<int>() == 3 );
    assert( a2.to_string() == "101" );
    
    // there are bitwise member and non-member functions
    auto a3 = wolf;
    a3 &= animal{"001"};
    assert( a3 == animal{flag<eats_meat>{1}} );
    assert( (a3 | animal{2}) == animal{3} );
    
    //wolf.set<build_spaceships>(); // compile error!
    //wolf = engineer{1}; // compile error!
}